

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bson_parser.hpp
# Opt level: O2

void __thiscall
jsoncons::bson::basic_bson_parser<jsoncons::bytes_source,_std::allocator<char>_>::parse
          (basic_bson_parser<jsoncons::bytes_source,_std::allocator<char>_> *this,
          json_visitor *visitor,error_code *ec)

{
  pointer ppVar1;
  value_type *pvVar2;
  value_type *pvVar3;
  pointer ppVar4;
  uint8_t uVar5;
  assertion_error *this_00;
  ulong uVar6;
  allocator<char> local_59;
  error_code *local_58;
  uint8_t type;
  
  local_58 = ec;
switchD_001a063e_default:
  if (this->done_ != false) {
    return;
  }
  if (this->more_ != true) {
    return;
  }
  ppVar1 = (this->state_stack_).
           super__Vector_base<jsoncons::bson::parse_state,_std::allocator<jsoncons::bson::parse_state>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  switch(ppVar1[-1].mode) {
  case root:
    ppVar1[-1].mode = accept;
    begin_document(this,visitor,ec);
    goto switchD_001a063e_default;
  case accept:
    ppVar4 = (this->state_stack_).
             super__Vector_base<jsoncons::bson::parse_state,_std::allocator<jsoncons::bson::parse_state>_>
             ._M_impl.super__Vector_impl_data._M_start;
    if ((long)ppVar1 - (long)ppVar4 != 0x28) {
      this_00 = (assertion_error *)__cxa_allocate_exception(0x10);
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&type,"assertion \'state_stack_.size() == 1\' failed at  <> :0",&local_59
                );
      assertion_error::assertion_error(this_00,(string *)&type);
      __cxa_throw(this_00,&assertion_error::typeinfo,std::runtime_error::~runtime_error);
    }
    if (ppVar1 != ppVar4) {
      (this->state_stack_).
      super__Vector_base<jsoncons::bson::parse_state,_std::allocator<jsoncons::bson::parse_state>_>.
      _M_impl.super__Vector_impl_data._M_finish = ppVar4;
    }
    this->more_ = false;
    this->done_ = true;
    (*visitor->_vptr_basic_json_visitor[2])(visitor);
    goto switchD_001a063e_default;
  case document:
    pvVar2 = (this->source_).current_;
    pvVar3 = (this->source_).end_;
    uVar6 = (ulong)(pvVar3 != pvVar2);
    memcpy(&type,pvVar2,uVar6);
    uVar5 = type;
    ec = local_58;
    (this->source_).current_ = pvVar2 + uVar6;
    ppVar1[-1].pos = ppVar1[-1].pos + uVar6;
    if (pvVar3 != pvVar2) {
      if (type == '\0') {
        end_document(this,visitor,local_58);
      }
      else {
        read_e_name(this,visitor,document,local_58);
        ppVar1 = (this->state_stack_).
                 super__Vector_base<jsoncons::bson::parse_state,_std::allocator<jsoncons::bson::parse_state>_>
                 ._M_impl.super__Vector_impl_data._M_finish;
        ppVar1[-1].mode = value;
        ppVar1[-1].type = uVar5;
      }
      goto switchD_001a063e_default;
    }
    break;
  case array:
    pvVar2 = (this->source_).current_;
    pvVar3 = (this->source_).end_;
    uVar6 = (ulong)(pvVar3 != pvVar2);
    memcpy(&type,pvVar2,uVar6);
    uVar5 = type;
    ec = local_58;
    (this->source_).current_ = pvVar2 + uVar6;
    ppVar1[-1].pos = ppVar1[-1].pos + uVar6;
    if (pvVar3 != pvVar2) {
      if (type == '\0') {
        end_array(this,visitor,local_58);
      }
      else {
        read_e_name(this,visitor,array,local_58);
        read_value(this,visitor,uVar5,ec);
      }
      goto switchD_001a063e_default;
    }
    break;
  case value:
    ppVar1[-1].mode = document;
    read_value(this,visitor,ppVar1[-1].type,ec);
  default:
    goto switchD_001a063e_default;
  }
  std::error_code::operator=(local_58,unexpected_eof);
  this->more_ = false;
  return;
}

Assistant:

void parse(json_visitor& visitor, std::error_code& ec)
    {
        if (JSONCONS_UNLIKELY(source_.is_error()))
        {
            ec = bson_errc::source_error;
            more_ = false;
            return;
        }
        
        while (!done_ && more_)
        {
            switch (state_stack_.back().mode)
            {
                case parse_mode::root:
                    state_stack_.back().mode = parse_mode::accept;
                    begin_document(visitor, ec);
                    break;
                case parse_mode::document:
                {
                    uint8_t type;
                    std::size_t n = source_.read(&type, 1);
                    state_stack_.back().pos += n;
                    if (JSONCONS_UNLIKELY(n != 1))
                    {
                        ec = bson_errc::unexpected_eof;
                        more_ = false;
                        return;
                    }
                    if (type != 0x00)
                    {
                        read_e_name(visitor,jsoncons::bson::bson_container_type::document,ec);
                        state_stack_.back().mode = parse_mode::value;
                        state_stack_.back().type = type;
                    }
                    else
                    {
                        end_document(visitor,ec);
                    }
                    break;
                }
                case parse_mode::array:
                {
                    uint8_t type;
                    std::size_t n = source_.read(&type, 1);
                    state_stack_.back().pos += n;
                    if (JSONCONS_UNLIKELY(n != 1))
                    {
                        ec = bson_errc::unexpected_eof;
                        more_ = false;
                        return;
                    }
                    if (type != 0x00)
                    {
                        read_e_name(visitor,jsoncons::bson::bson_container_type::array,ec);
                        read_value(visitor, type, ec);
                    }
                    else
                    {
                        end_array(visitor,ec);
                    }
                    break;
                }
                case parse_mode::value:
                    state_stack_.back().mode = parse_mode::document;
                    read_value(visitor,state_stack_.back().type,ec);
                    break;
                case parse_mode::accept:
                {
                    JSONCONS_ASSERT(state_stack_.size() == 1);
                    state_stack_.clear();
                    more_ = false;
                    done_ = true;
                    visitor.flush();
                    break;
                }
            }
        }
    }